

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

archive_acl_entry *
acl_new_entry(archive_acl *acl,wchar_t type,wchar_t permset,wchar_t tag,wchar_t id)

{
  uint uVar1;
  archive_acl_entry *paVar2;
  archive_acl_entry *paVar3;
  
  if ((type & 0x3c00U) == 0) {
    if ((type & 0x300U) == 0) {
      return (archive_acl_entry *)0x0;
    }
    if (7 < (uint)permset) {
      return (archive_acl_entry *)0x0;
    }
    if ((acl->acl_types & 0xfffffcffU) != 0) {
      return (archive_acl_entry *)0x0;
    }
  }
  else if ((permset & 0x80ff0006U) != 0 || (acl->acl_types & 0xffffc3ffU) != 0) {
    return (archive_acl_entry *)0x0;
  }
  if (3 < (uint)(tag + L'\xffffd8ef')) {
    if ((uint)(tag + L'\xffffd8eb') < 2) {
      uVar1 = type & 0xfffffcff;
    }
    else {
      if (tag != L'❻') {
        return (archive_acl_entry *)0x0;
      }
      uVar1 = type & 0xffffc3ff;
    }
    if (uVar1 != 0) {
      return (archive_acl_entry *)0x0;
    }
  }
  free(acl->acl_text_w);
  acl->acl_text_w = (wchar_t *)0x0;
  free(acl->acl_text);
  acl->acl_text = (char *)0x0;
  if (acl->acl_head == (archive_acl_entry *)0x0) {
    paVar2 = (archive_acl_entry *)calloc(1,0x80);
    if (paVar2 != (archive_acl_entry *)0x0) {
      acl->acl_head = paVar2;
      goto LAB_0016cf1d;
    }
  }
  else {
    paVar2 = acl->acl_head;
    do {
      paVar3 = paVar2;
      if (((((type & 0x3c00U) == 0) && (paVar3->type == type)) && (paVar3->tag == tag)) &&
         (paVar3->id == id && ((tag & 0xfffffffdU) != 0x2711 || id != L'\xffffffff'))) {
        paVar3->permset = permset;
        return paVar3;
      }
      paVar2 = paVar3->next;
    } while (paVar3->next != (archive_acl_entry *)0x0);
    paVar2 = (archive_acl_entry *)calloc(1,0x80);
    if (paVar2 != (archive_acl_entry *)0x0) {
      paVar3->next = paVar2;
LAB_0016cf1d:
      paVar2->type = type;
      paVar2->tag = tag;
      paVar2->id = id;
      paVar2->permset = permset;
      acl->acl_types = acl->acl_types | type;
      return paVar2;
    }
  }
  return (archive_acl_entry *)0x0;
}

Assistant:

static struct archive_acl_entry *
acl_new_entry(struct archive_acl *acl,
    int type, int permset, int tag, int id)
{
	struct archive_acl_entry *ap, *aq;

	/* Type argument must be a valid NFS4 or POSIX.1e type.
	 * The type must agree with anything already set and
	 * the permset must be compatible. */
	if (type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
		if (acl->acl_types & ~ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			return (NULL);
		}
		if (permset &
		    ~(ARCHIVE_ENTRY_ACL_PERMS_NFS4
			| ARCHIVE_ENTRY_ACL_INHERITANCE_NFS4)) {
			return (NULL);
		}
	} else	if (type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) {
		if (acl->acl_types & ~ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) {
			return (NULL);
		}
		if (permset & ~ARCHIVE_ENTRY_ACL_PERMS_POSIX1E) {
			return (NULL);
		}
	} else {
		return (NULL);
	}

	/* Verify the tag is valid and compatible with NFS4 or POSIX.1e. */
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER:
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
	case ARCHIVE_ENTRY_ACL_GROUP:
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		/* Tags valid in both NFS4 and POSIX.1e */
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
	case ARCHIVE_ENTRY_ACL_OTHER:
		/* Tags valid only in POSIX.1e. */
		if (type & ~ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) {
			return (NULL);
		}
		break;
	case ARCHIVE_ENTRY_ACL_EVERYONE:
		/* Tags valid only in NFS4. */
		if (type & ~ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			return (NULL);
		}
		break;
	default:
		/* No other values are valid. */
		return (NULL);
	}

	free(acl->acl_text_w);
	acl->acl_text_w = NULL;
	free(acl->acl_text);
	acl->acl_text = NULL;

	/*
	 * If there's a matching entry already in the list, overwrite it.
	 * NFSv4 entries may be repeated and are not overwritten.
	 *
	 * TODO: compare names of no id is provided (needs more rework)
	 */
	ap = acl->acl_head;
	aq = NULL;
	while (ap != NULL) {
		if (((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) == 0) &&
		    ap->type == type && ap->tag == tag && ap->id == id) {
			if (id != -1 || (tag != ARCHIVE_ENTRY_ACL_USER &&
			    tag != ARCHIVE_ENTRY_ACL_GROUP)) {
				ap->permset = permset;
				return (ap);
			}
		}
		aq = ap;
		ap = ap->next;
	}

	/* Add a new entry to the end of the list. */
	ap = calloc(1, sizeof(*ap));
	if (ap == NULL)
		return (NULL);
	if (aq == NULL)
		acl->acl_head = ap;
	else
		aq->next = ap;
	ap->type = type;
	ap->tag = tag;
	ap->id = id;
	ap->permset = permset;
	acl->acl_types |= type;
	return (ap);
}